

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O1

void __thiscall ImgfsFile::NameEntry::getdata(NameEntry *this,uint8_t *p,ImgfsFile *param_2)

{
  Wstring wstr;
  Wstring local_30;
  
  *(uint32_t *)p = (this->super_DirEntry)._magic;
  ToWString<char>(&local_30,&this->_name);
  std::__cxx11::
  basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>::
  resize(&local_30,0x18,0);
  if (local_30._M_string_length != 0) {
    memmove(p + 4,local_30._M_dataplus._M_p,local_30._M_string_length * 2);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity * 2 + 2);
  }
  return;
}

Assistant:

virtual void getdata(uint8_t* p, ImgfsFile& /*imgfs*/)
        {
            set32le(p, _magic);
            std::Wstring wstr= ToWString(_name);
            wstr.resize(24);
            // note: nonportable endian cast
            std::copy(wstr.begin(), wstr.end(), (WCHAR*)(p+4));
        }